

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

DetectorResult * ZXing::QRCode::SampleMQR(BitMatrix *image,ConcentricPattern *fp)

{
  PointF p;
  PointT<double> d;
  PointT<double> p_00;
  PointT<double> pos;
  PointT<double> pos_00;
  bool bVar1;
  PointI PVar2;
  undefined8 *in_RDX;
  PerspectiveTransform *in_RSI;
  PointI in_RDI;
  PointF PVar3;
  PointF PVar4;
  FormatInformation FVar5;
  PointF py;
  PointF px;
  int i_2;
  int blackPixels;
  int dim;
  FormatInformation fi;
  int i_1;
  int formatInfoBits;
  anon_class_24_3_8006d00c check;
  PerspectiveTransform mod2Pix;
  int i;
  BitMatrixCursorF cur;
  PerspectiveTransform bestPT;
  FormatInformation bestFI;
  PointI FORMAT_INFO_COORDS [17];
  Quadrilateral<ZXing::PointT<double>_> srcQuad;
  optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> fpQuad;
  bool local_361;
  DetectorResult *in_stack_fffffffffffffca0;
  PerspectiveTransform *this;
  Type type;
  int version;
  double in_stack_fffffffffffffcb8;
  BitMatrixCursor<ZXing::PointT<double>_> *in_stack_fffffffffffffcc0;
  BitMatrixCursor<ZXing::PointT<double>_> *this_00;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 uVar6;
  int in_stack_fffffffffffffccc;
  undefined4 uVar7;
  Quadrilateral<ZXing::PointT<double>_> *in_stack_fffffffffffffcd0;
  PointT<int> local_328 [2];
  undefined1 in_stack_fffffffffffffcf0 [16];
  PointT<int> in_stack_fffffffffffffd00;
  double local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  uint8_t local_2b8;
  uint8_t uStack_2b7;
  undefined2 uStack_2b6;
  ErrorCorrectionLevel EStack_2b4;
  FormatInformation in_stack_fffffffffffffd40;
  PointF in_stack_fffffffffffffd58;
  PointF in_stack_fffffffffffffd68;
  int local_288;
  int local_284;
  undefined1 *local_280;
  undefined1 *local_278;
  PerspectiveTransform *local_270;
  QuadrilateralF *in_stack_fffffffffffffdc0;
  QuadrilateralF *in_stack_fffffffffffffdc8;
  PerspectiveTransform *in_stack_fffffffffffffdd0;
  undefined1 local_228 [76];
  int local_1dc;
  PointT<double> local_1d8;
  PointT<double> local_1c8;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  BitMatrix *in_stack_fffffffffffffe50;
  PointF in_stack_fffffffffffffe58;
  PerspectiveTransform local_190;
  FormatInformation local_148;
  undefined1 local_138 [200];
  undefined8 local_70;
  undefined8 local_68;
  PerspectiveTransform *local_10;
  
  type = in_RDI.x;
  version = in_RDI.y;
  local_70 = *in_RDX;
  local_68 = in_RDX[1];
  local_10 = in_RSI;
  FindConcentricPatternCorners
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe4c,
             in_stack_fffffffffffffe48);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)0x2f1f1f);
  if (bVar1) {
    Rectangle<ZXing::PointT<double>>
              (in_stack_fffffffffffffcf0._4_4_,in_stack_fffffffffffffcf0._0_4_,local_328[2]);
    memcpy(local_138,&DAT_003195a0,0x88);
    FormatInformation::FormatInformation(&local_148);
    PerspectiveTransform::PerspectiveTransform(&local_190);
    this = local_10;
    memset(&local_1c8,0,0x10);
    PointT<double>::PointT(&local_1c8);
    memset(&local_1d8,0,0x10);
    PointT<double>::PointT(&local_1d8);
    p_00.x._4_4_ = in_stack_fffffffffffffccc;
    p_00.x._0_4_ = in_stack_fffffffffffffcc8;
    p_00.y = (double)in_stack_fffffffffffffcd0;
    d.y = (double)in_stack_fffffffffffffcc0;
    d.x = in_stack_fffffffffffffcb8;
    BitMatrixCursor<ZXing::PointT<double>_>::BitMatrixCursor
              ((BitMatrixCursor<ZXing::PointT<double>_> *)in_RDI,(BitMatrix *)CONCAT44(version,type)
               ,p_00,d);
    for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
      std::optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_>::operator*
                ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)0x2f203d);
      RotatedCorners<ZXing::PointT<double>>
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                 SUB41((uint)in_stack_fffffffffffffcc8 >> 0x18,0));
      PerspectiveTransform::PerspectiveTransform
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      local_280 = local_228;
      local_278 = local_138;
      local_270 = local_10;
      bVar1 = SampleMQR::anon_class_24_3_8006d00c::operator()
                        ((anon_class_24_3_8006d00c *)in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcf0._12_4_,in_stack_fffffffffffffcf0[0xb]);
      if (((bVar1) &&
          (bVar1 = SampleMQR::anon_class_24_3_8006d00c::operator()
                             ((anon_class_24_3_8006d00c *)in_stack_fffffffffffffd00,
                              in_stack_fffffffffffffcf0._12_4_,in_stack_fffffffffffffcf0[0xb]),
          bVar1)) &&
         (bVar1 = SampleMQR::anon_class_24_3_8006d00c::operator()
                            ((anon_class_24_3_8006d00c *)in_stack_fffffffffffffd00,
                             in_stack_fffffffffffffcf0._12_4_,in_stack_fffffffffffffcf0[0xb]), bVar1
         )) {
        local_284 = 0;
        for (local_288 = 1; local_288 < 0x10; local_288 = local_288 + 1) {
          in_stack_fffffffffffffd58 = centered(in_RDI);
          PVar3.x._4_4_ = version;
          PVar3.x._0_4_ = type;
          PVar3.y = (double)in_RDI;
          in_stack_fffffffffffffd68 = PerspectiveTransform::operator()(this,PVar3);
          pos.x._4_4_ = in_stack_fffffffffffffccc;
          pos.x._0_4_ = in_stack_fffffffffffffcc8;
          pos.y = (double)in_stack_fffffffffffffcd0;
          bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(in_stack_fffffffffffffcc0,pos);
          AppendBit<int,void>(&local_284,bVar1);
        }
        FVar5 = FormatInformation::DecodeMQR(in_stack_fffffffffffffd40._4_4_);
        bVar1 = FVar5.hammingDistance < local_148.hammingDistance;
        in_stack_fffffffffffffd40 = FVar5;
        if (bVar1) {
          _local_2b8 = FVar5._8_8_;
          local_148.dataMask = local_2b8;
          local_148.microVersion = uStack_2b7;
          local_148._10_2_ = uStack_2b6;
          local_148.ecLevel = EStack_2b4;
          local_148._0_8_ = FVar5._0_8_;
          memcpy(&local_190,local_228,0x48);
        }
      }
    }
    bVar1 = FormatInformation::isValid(&local_148);
    if (bVar1) {
      PVar2 = Version::SymbolSize(version,type);
      local_2cc = PVar2.x;
      local_2d0 = 0;
      for (local_2d4 = 0; local_2d4 < local_2cc; local_2d4 = local_2d4 + 1) {
        PointT<int>::PointT((PointT<int> *)&stack0xfffffffffffffd00,local_2d4,local_2cc);
        centered(in_RDI);
        PVar4.x._4_4_ = version;
        PVar4.x._0_4_ = type;
        PVar4.y = (double)in_RDI;
        PVar3 = PerspectiveTransform::operator()(this,PVar4);
        PointT<int>::PointT(local_328,local_2cc,local_2d4);
        join_0x00001240_0x00001200_ = centered(in_RDI);
        p.x._4_4_ = version;
        p.x._0_4_ = type;
        p.y = (double)in_RDI;
        PVar4 = PerspectiveTransform::operator()(this,p);
        this_00 = (BitMatrixCursor<ZXing::PointT<double>_> *)PVar4.y;
        uVar6 = PVar3.x._0_4_;
        uVar7 = PVar3.x._4_4_;
        local_2e0 = PVar3.y;
        bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(in_stack_fffffffffffffcc0,PVar3);
        local_361 = false;
        if (bVar1) {
          pos_00.x._4_4_ = uVar7;
          pos_00.x._0_4_ = uVar6;
          pos_00.y = local_2e0;
          local_361 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(this_00,pos_00);
          in_stack_fffffffffffffcc0 = this_00;
        }
        local_2d0 = (uint)local_361 + local_2d0;
      }
      if ((local_2cc << 1) / 3 < local_2d0) {
        memset((void *)CONCAT44(version,type),0,0x40);
        DetectorResult::DetectorResult((DetectorResult *)this);
      }
      else {
        SampleGrid((BitMatrix *)in_stack_fffffffffffffd68.x,in_stack_fffffffffffffd58.y._4_4_,
                   in_stack_fffffffffffffd58.y._0_4_,
                   (PerspectiveTransform *)in_stack_fffffffffffffd58.x);
      }
    }
    else {
      memset((void *)CONCAT44(version,type),0,0x40);
      DetectorResult::DetectorResult((DetectorResult *)this);
    }
  }
  else {
    memset((void *)CONCAT44(version,type),0,0x40);
    DetectorResult::DetectorResult(in_stack_fffffffffffffca0);
  }
  return (DetectorResult *)in_RDI;
}

Assistant:

DetectorResult SampleMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

#if defined(_MSVC_LANG) // TODO: see MSVC issue https://developercommunity.visualstudio.com/t/constexpr-object-is-unable-to-be-used-as/10035065
	static
#else
	constexpr
#endif
		const PointI FORMAT_INFO_COORDS[] = {{0, 8}, {1, 8}, {2, 8}, {3, 8}, {4, 8}, {5, 8}, {6, 8}, {7, 8}, {8, 8},
											 {8, 7}, {8, 6}, {8, 5}, {8, 4}, {8, 3}, {8, 2}, {8, 1}, {8, 0}};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool checkOne) {
			auto p = mod2Pix(centered(FORMAT_INFO_COORDS[i]));
			return image.isIn(p) && (!checkOne || image.get(p));
		};

		// check that we see both innermost timing pattern modules
		if (!check(0, true) || !check(8, false) || !check(16, true))
			continue;

		int formatInfoBits = 0;
		for (int i = 1; i <= 15; ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeMQR(formatInfoBits);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const int dim = Version::SymbolSize(bestFI.microVersion, Type::Micro).x;

	// check that we are in fact not looking at a corner of a non-micro QRCode symbol
	// we accept at most 1/3rd black pixels in the quite zone (in a QRCode symbol we expect about 1/2).
	int blackPixels = 0;
	for (int i = 0; i < dim; ++i) {
		auto px = bestPT(centered(PointI{i, dim}));
		auto py = bestPT(centered(PointI{dim, i}));
		blackPixels += cur.blackAt(px) && cur.blackAt(py);
	}
	if (blackPixels > 2 * dim / 3)
		return {};

	return SampleGrid(image, dim, dim, bestPT);
}

DetectorResult SampleRMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

	static const PointI FORMAT_INFO_EDGE_COORDS[] = {{8, 0}, {9, 0}, {10, 0}, {11, 0}};
	static const PointI FORMAT_INFO_COORDS[] = {
		{11, 3}, {11, 2}, {11, 1},
		{10, 5}, {10, 4}, {10, 3}, {10, 2}, {10, 1},
		{ 9, 5}, { 9, 4}, { 9, 3}, { 9, 2}, { 9, 1},
		{ 8, 5}, { 8, 4}, { 8, 3}, { 8, 2}, { 8, 1},
	};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool on) {
			return cur.testAt(mod2Pix(centered(FORMAT_INFO_EDGE_COORDS[i]))) == BitMatrixCursorF::Value(on);
		};

		// check that we see top edge timing pattern modules
		if (!check(0, true) || !check(1, false) || !check(2, true) || !check(3, false))
			continue;

		uint32_t formatInfoBits = 0;
		for (int i = 0; i < Size(FORMAT_INFO_COORDS); ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeRMQR(formatInfoBits, 0 /*formatInfoBits2*/);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const PointI dim = Version::SymbolSize(bestFI.microVersion, Type::rMQR);

	// TODO: this is a WIP
	auto intersectQuads = [](QuadrilateralF& a, QuadrilateralF& b) {
		auto tl = Center(a);
		auto br = Center(b);
		// rotate points such that topLeft of a is furthest away from b and topLeft of b is closest to a
		auto dist2B = [c = br](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetA = narrow_cast<int>(std::max_element(a.begin(), a.end(), dist2B) - a.begin());
		auto dist2A = [c = tl](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetB = narrow_cast<int>(std::min_element(b.begin(), b.end(), dist2A) - b.begin());

		a = RotatedCorners(a, offsetA);
		b = RotatedCorners(b, offsetB);

		auto tr = (intersect(RegressionLine(a[0], a[1]), RegressionLine(b[1], b[2]))
				   + intersect(RegressionLine(a[3], a[2]), RegressionLine(b[0], b[3])))
				  / 2;
		auto bl = (intersect(RegressionLine(a[0], a[3]), RegressionLine(b[2], b[3]))
				   + intersect(RegressionLine(a[1], a[2]), RegressionLine(b[0], b[1])))
				  / 2;

		log(tr, 2);
		log(bl, 2);

		return QuadrilateralF{tl, tr, br, bl};
	};

	if (auto found = LocateAlignmentPattern(image, fp.size / 7, bestPT(dim - PointF(3, 3)))) {
		log(*found, 2);
		if (auto spQuad = FindConcentricPatternCorners(image, *found, fp.size / 2, 1)) {
			auto dest = intersectQuads(*fpQuad, *spQuad);
			if (dim.y <= 9) {
				bestPT = PerspectiveTransform({{6.5, 0.5}, {dim.x - 1.5, dim.y - 3.5}, {dim.x - 1.5, dim.y - 1.5}, {6.5, 6.5}},
											  {fpQuad->topRight(), spQuad->topRight(), spQuad->bottomRight(), fpQuad->bottomRight()});
			} else {
				dest[0] = fp;
				dest[2] = *found;
				bestPT = PerspectiveTransform({{3.5, 3.5}, {dim.x - 2.5, 3.5}, {dim.x - 2.5, dim.y - 2.5}, {3.5, dim.y - 2.5}}, dest);
			}
		}
	}

	return SampleGrid(image, dim.x, dim.y, bestPT);
}

}